

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,ElementsConfidentialAddress *confidential_address,
          ConfidentialAssetId *asset,Amount *amount)

{
  Script local_60;
  
  ElementsConfidentialAddress::GetLockingScript(&local_60,confidential_address);
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&local_60);
  Script::~Script(&local_60);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_00740b98;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,asset);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,amount);
  ElementsConfidentialAddress::GetConfidentialKey((ConfidentialKey *)&local_60,confidential_address)
  ;
  ConfidentialNonce::ConfidentialNonce(&this->nonce_,(Pubkey *)&local_60);
  if (local_60._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_60._vptr_Script);
  }
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const ElementsConfidentialAddress &confidential_address,
    const ConfidentialAssetId &asset, const Amount &amount)
    : AbstractTxOut(confidential_address.GetLockingScript()),
      asset_(asset),
      confidential_value_(ConfidentialValue(amount)),
      nonce_(confidential_address.GetConfidentialKey()),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}